

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVST3LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  DecodeStatus DVar4;
  uint uVar5;
  uint uVar6;
  
  DVar4 = MCDisassembler_Fail;
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 5 & 7;
    iVar3 = 1;
    goto LAB_00150bc5;
  case 1:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 6 & 3;
    uVar2 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x30) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 7 & 1;
    uVar2 = Insn & 0x40;
    break;
  case 3:
    goto switchD_00150b64_caseD_3;
  }
  iVar3 = 2 - (uint)(uVar2 == 0);
LAB_00150bc5:
  uVar6 = Insn & 0xf;
  uVar2 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar1 = GPRDecoderTable[Insn >> 0x10 & 0xf];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  if (uVar6 == 0xf) {
    MCOperand_CreateImm0(Inst,0);
  }
  else {
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    MCOperand_CreateImm0(Inst,0);
    if (uVar6 == 0xd) {
      uVar6 = 0;
    }
    else {
      uVar6 = (uint)GPRDecoderTable[uVar6];
    }
    MCOperand_CreateReg0(Inst,uVar6);
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar2]);
  DVar4 = MCDisassembler_Fail;
  if (uVar2 + iVar3 < 0x20) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar2 + iVar3]);
    uVar2 = uVar2 + iVar3 * 2;
    if (uVar2 < 0x20) {
      MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar2]);
      MCOperand_CreateImm0(Inst,(ulong)uVar5);
      DVar4 = MCDisassembler_Success;
    }
  }
switchD_00150b64_caseD_3:
  return DVar4;
}

Assistant:

static DecodeStatus DecodeVST3LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 4, 2))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}